

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioply.c
# Opt level: O2

int trico_read_ply(uint32_t *nr_of_vertices,float **vertices,float **vertex_normals,
                  uint32_t **vertex_colors,uint32_t *nr_of_triangles,uint32_t **triangles,
                  float **texcoords,char *filename)

{
  uint uVar1;
  uint32_t **ppuVar2;
  uint32_t **ppuVar3;
  int iVar4;
  uint32_t uVar5;
  p_ply ptVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  float *pfVar10;
  long lVar11;
  uint8_t *p_alpha;
  uint8_t *p_blue;
  p_ply local_98;
  uint32_t **local_90;
  uint8_t *p_green;
  uint8_t *p_red;
  uint32_t *p_tria_index;
  float *p_vertex_pointer_z;
  uint32_t **local_68;
  float *p_uv;
  float *p_normal_pointer_z;
  float *p_normal_pointer_y;
  float *p_normal_pointer_x;
  float *p_vertex_pointer_y;
  float *p_vertex_pointer_x;
  
  *nr_of_vertices = 0;
  *vertices = (float *)0x0;
  *vertex_normals = (float *)0x0;
  *vertex_colors = (uint32_t *)0x0;
  *nr_of_triangles = 0;
  *triangles = (uint32_t *)0x0;
  *texcoords = (float *)0x0;
  local_90 = vertex_colors;
  ptVar6 = ply_open(filename,(p_ply_error_cb)0x0,0,(void *)0x0);
  if (ptVar6 == (p_ply)0x0) {
    return 0;
  }
  iVar4 = ply_read_header(ptVar6);
  if (iVar4 == 0) {
    return 0;
  }
  p_vertex_pointer_x = (float *)0x0;
  p_vertex_pointer_y = (float *)0x0;
  p_vertex_pointer_z = (float *)0x0;
  iVar4 = 0;
  local_68 = triangles;
  lVar7 = ply_set_read_cb(ptVar6,"vertex","x",read_vec3_coord,&p_vertex_pointer_x,0);
  lVar8 = ply_set_read_cb(ptVar6,"vertex","y",read_vec3_coord,&p_vertex_pointer_y,0);
  local_98 = ptVar6;
  lVar9 = ply_set_read_cb(ptVar6,"vertex","z",read_vec3_coord,&p_vertex_pointer_z,0);
  ptVar6 = local_98;
  if ((lVar7 != lVar8) || (lVar7 != lVar9)) goto LAB_00108218;
  *nr_of_vertices = (uint32_t)lVar7;
  if (lVar7 < 1) {
    p_vertex_pointer_x = *vertices;
  }
  else {
    p_vertex_pointer_x = (float *)malloc(lVar7 * 0xc & 0x3fffffffc);
    *vertices = p_vertex_pointer_x;
  }
  ptVar6 = local_98;
  p_vertex_pointer_y = p_vertex_pointer_x + 1;
  p_vertex_pointer_z = p_vertex_pointer_x + 2;
  p_normal_pointer_x = (float *)0x0;
  p_normal_pointer_y = (float *)0x0;
  p_normal_pointer_z = (float *)0x0;
  lVar7 = ply_set_read_cb(local_98,"vertex","nx",read_vec3_coord,&p_normal_pointer_x,0);
  lVar8 = ply_set_read_cb(ptVar6,"vertex","ny",read_vec3_coord,&p_normal_pointer_y,0);
  lVar9 = ply_set_read_cb(ptVar6,"vertex","nz",read_vec3_coord,&p_normal_pointer_z,0);
  if ((lVar7 != lVar8) || (lVar7 != lVar9)) {
    uVar5 = *nr_of_vertices;
LAB_00108601:
    if (uVar5 != 0) {
      free(*vertices);
      *vertices = (float *)0x0;
      *nr_of_vertices = 0;
    }
LAB_0010861a:
    ply_close(ptVar6);
    return 0;
  }
  if (lVar7 != 0) {
    uVar5 = *nr_of_vertices;
    if (uVar5 != (uint32_t)lVar7) goto LAB_00108601;
    if (0 < lVar7) {
      pfVar10 = (float *)malloc(lVar7 * 0xc & 0x3fffffffc);
      *vertex_normals = pfVar10;
    }
  }
  p_normal_pointer_x = *vertex_normals;
  p_normal_pointer_y = p_normal_pointer_x + 1;
  p_normal_pointer_z = p_normal_pointer_x + 2;
  p_red = (uint8_t *)0x0;
  p_green = (uint8_t *)0x0;
  p_blue = (uint8_t *)0x0;
  p_alpha = (uint8_t *)0x0;
  lVar7 = ply_set_read_cb(ptVar6,"vertex","red",read_color,&p_red,0);
  lVar8 = ply_set_read_cb(ptVar6,"vertex","green",read_color,&p_green,0);
  lVar9 = ply_set_read_cb(ptVar6,"vertex","blue",read_color,&p_blue,0);
  lVar11 = ply_set_read_cb(ptVar6,"vertex","alpha",read_color,&p_alpha,0);
  if (lVar7 == 0) {
    lVar7 = ply_set_read_cb(ptVar6,"vertex","r",read_color,&p_red,0);
  }
  ppuVar3 = local_68;
  if (lVar8 == 0) {
    lVar8 = ply_set_read_cb(ptVar6,"vertex","g",read_color,&p_green,0);
  }
  if (lVar9 == 0) {
    lVar9 = ply_set_read_cb(ptVar6,"vertex","b",read_color,&p_blue,0);
  }
  if (lVar11 == 0) {
    lVar11 = ply_set_read_cb(ptVar6,"vertex","a",read_color,&p_alpha,0);
  }
  if (lVar7 == 0) {
    lVar7 = ply_set_read_cb(ptVar6,"vertex","diffuse_red",read_color,&p_red,0);
  }
  if (lVar8 == 0) {
    lVar8 = ply_set_read_cb(ptVar6,"vertex","diffuse_green",read_color,&p_green,0);
  }
  if (lVar9 == 0) {
    lVar9 = ply_set_read_cb(ptVar6,"vertex","diffuse_blue",read_color,&p_blue,0);
  }
  if (lVar11 == 0) {
    lVar11 = ply_set_read_cb(ptVar6,"vertex","diffuse_alpha",read_color,&p_alpha,0);
  }
  if ((lVar11 < 1 && lVar9 < 1) && (lVar8 < 1 && lVar7 < 1)) {
    p_red = (uint8_t *)*local_90;
  }
  else {
    uVar1 = *nr_of_vertices;
    if ((((uVar1 != (uint)lVar7 && lVar7 != 0) || (uVar1 != (uint)lVar8 && lVar8 != 0)) ||
        (uVar1 != (uint)lVar9 && lVar9 != 0)) || (uVar1 != (uint)lVar11 && lVar11 != 0)) {
      if ((ulong)uVar1 != 0) {
        free(*vertices);
        free(*vertex_normals);
        *vertices = (float *)0x0;
        *vertex_normals = (float *)0x0;
        *nr_of_vertices = 0;
      }
      goto LAB_0010861a;
    }
    p_red = (uint8_t *)malloc((ulong)uVar1 * 4);
    *local_90 = (uint32_t *)p_red;
    for (lVar7 = 0; uVar1 != (uint)lVar7; lVar7 = lVar7 + 1) {
      *(uint32_t *)((long)p_red + lVar7 * 4) = 0xffffffff;
    }
  }
  p_green = (uint8_t *)((long)p_red + 1);
  p_blue = (uint8_t *)((long)p_red + 2);
  p_alpha = (uint8_t *)((long)p_red + 3);
  p_tria_index = (uint32_t *)0x0;
  lVar7 = ply_set_read_cb(ptVar6,"face","vertex_indices",read_face,&p_tria_index,0);
  if (lVar7 == 0) {
    lVar7 = ply_set_read_cb(ptVar6,"face","vertex_index",read_face,&p_tria_index,0);
  }
  *nr_of_triangles = (uint32_t)lVar7;
  if (lVar7 < 1) {
    p_tria_index = *ppuVar3;
  }
  else {
    p_tria_index = (uint32_t *)malloc(lVar7 * 0xc & 0x3fffffffc);
    *ppuVar3 = p_tria_index;
  }
  p_uv = (float *)0x0;
  lVar7 = ply_set_read_cb(ptVar6,"face","texcoord",read_texcoord,&p_uv,0);
  if (lVar7 != 0) {
    uVar5 = *nr_of_triangles;
    if (uVar5 != (uint32_t)lVar7) {
      if (*nr_of_vertices != 0) {
        free(*vertices);
        free(*vertex_normals);
        ppuVar2 = local_90;
        free(*local_90);
        *vertices = (float *)0x0;
        *vertex_normals = (float *)0x0;
        *ppuVar2 = (uint32_t *)0x0;
        *nr_of_vertices = 0;
        uVar5 = *nr_of_triangles;
      }
      iVar4 = 0;
      if (uVar5 != 0) {
        free(*ppuVar3);
        *ppuVar3 = (uint32_t *)0x0;
        *nr_of_triangles = 0;
      }
      goto LAB_00108218;
    }
    if (0 < lVar7) {
      pfVar10 = (float *)malloc(lVar7 * 0x18 & 0x3fffffff8);
      *texcoords = pfVar10;
    }
  }
  p_uv = *texcoords;
  iVar4 = ply_read(ptVar6);
  if (iVar4 == 0) {
    return 0;
  }
  iVar4 = 1;
LAB_00108218:
  ply_close(ptVar6);
  return iVar4;
}

Assistant:

int trico_read_ply(uint32_t* nr_of_vertices,
  float** vertices,
  float** vertex_normals,
  uint32_t** vertex_colors,
  uint32_t* nr_of_triangles,
  uint32_t** triangles,
  float** texcoords,
  const char* filename)
  {
  *nr_of_vertices = 0;
  *vertices = NULL;
  *vertex_normals = NULL;
  *vertex_colors = NULL;
  *nr_of_triangles = 0;
  *triangles = NULL;
  *texcoords = NULL;

  p_ply ply = ply_open(filename, NULL, 0, NULL);
  if (!ply)
    return 0;
  if (!ply_read_header(ply))
    return 0;

  float* p_vertex_pointer_x = NULL;
  float* p_vertex_pointer_y = NULL;
  float* p_vertex_pointer_z = NULL;

  long nvertices_x = ply_set_read_cb(ply, "vertex", "x", read_vec3_coord, (void*)(&p_vertex_pointer_x), 0);
  long nvertices_y = ply_set_read_cb(ply, "vertex", "y", read_vec3_coord, (void*)(&p_vertex_pointer_y), 0);
  long nvertices_z = ply_set_read_cb(ply, "vertex", "z", read_vec3_coord, (void*)(&p_vertex_pointer_z), 0);

  if ((nvertices_x != nvertices_y) || (nvertices_x != nvertices_z))
    {
    ply_close(ply);
    return 0;
    }

  *nr_of_vertices = (uint32_t)nvertices_x;

  if (nvertices_x > 0)
    *vertices = (float*)trico_malloc(*nr_of_vertices * 3 * sizeof(float));
  p_vertex_pointer_x = (float*)(*vertices);
  p_vertex_pointer_y = p_vertex_pointer_x + 1;
  p_vertex_pointer_z = p_vertex_pointer_x + 2;

  float* p_normal_pointer_x = NULL;
  float* p_normal_pointer_y = NULL;
  float* p_normal_pointer_z = NULL;

  long nnormals_x = ply_set_read_cb(ply, "vertex", "nx", read_vec3_coord, (void*)(&p_normal_pointer_x), 0);
  long nnormals_y = ply_set_read_cb(ply, "vertex", "ny", read_vec3_coord, (void*)(&p_normal_pointer_y), 0);
  long nnormals_z = ply_set_read_cb(ply, "vertex", "nz", read_vec3_coord, (void*)(&p_normal_pointer_z), 0);

  if ((nnormals_x != nnormals_y) || (nnormals_x != nnormals_z) || (nnormals_x && ((uint32_t)nnormals_x != *nr_of_vertices)))
    {
    if (*nr_of_vertices)
      {
      free(*vertices);
      *vertices = NULL;
      *nr_of_vertices = 0;
      }
    ply_close(ply);
    return 0;
    }

  if (nnormals_x > 0)
    *vertex_normals = (float*)trico_malloc(*nr_of_vertices * 3 * sizeof(float));
  p_normal_pointer_x = (float*)(*vertex_normals);
  p_normal_pointer_y = p_normal_pointer_x + 1;
  p_normal_pointer_z = p_normal_pointer_x + 2;

  uint8_t* p_red = NULL;
  uint8_t* p_green = NULL;
  uint8_t* p_blue = NULL;
  uint8_t* p_alpha = NULL;

  long nred = ply_set_read_cb(ply, "vertex", "red", read_color, (void*)(&p_red), 0);
  long ngreen = ply_set_read_cb(ply, "vertex", "green", read_color, (void*)(&p_green), 0);
  long nblue = ply_set_read_cb(ply, "vertex", "blue", read_color, (void*)(&p_blue), 0);
  long nalpha = ply_set_read_cb(ply, "vertex", "alpha", read_color, (void*)(&p_alpha), 0);

  if (nred == 0)
    nred = ply_set_read_cb(ply, "vertex", "r", read_color, (void*)(&p_red), 0);
  if (ngreen == 0)
    ngreen = ply_set_read_cb(ply, "vertex", "g", read_color, (void*)(&p_green), 0);
  if (nblue == 0)
    nblue = ply_set_read_cb(ply, "vertex", "b", read_color, (void*)(&p_blue), 0);
  if (nalpha == 0)
    nalpha = ply_set_read_cb(ply, "vertex", "a", read_color, (void*)(&p_alpha), 0);

  if (nred == 0)
    nred = ply_set_read_cb(ply, "vertex", "diffuse_red", read_color, (void*)(&p_red), 0);
  if (ngreen == 0)
    ngreen = ply_set_read_cb(ply, "vertex", "diffuse_green", read_color, (void*)(&p_green), 0);
  if (nblue == 0)
    nblue = ply_set_read_cb(ply, "vertex", "diffuse_blue", read_color, (void*)(&p_blue), 0);
  if (nalpha == 0)
    nalpha = ply_set_read_cb(ply, "vertex", "diffuse_alpha", read_color, (void*)(&p_alpha), 0);

  if (nred > 0 || ngreen > 0 || nblue > 0 || nalpha > 0)
    {
    if ((nred && ((uint32_t)nred != *nr_of_vertices)) || (ngreen && ((uint32_t)ngreen != *nr_of_vertices)) || (nblue && ((uint32_t)nblue != *nr_of_vertices)) || (nalpha && ((uint32_t)nalpha != *nr_of_vertices)))
      {
      if (*nr_of_vertices)
        {
        free(*vertices);
        free(*vertex_normals);
        *vertices = NULL;
        *vertex_normals = NULL;
        *nr_of_vertices = 0;
        }
      ply_close(ply);
      return 0;
      }
    *vertex_colors = (uint32_t*)trico_malloc(*nr_of_vertices * sizeof(uint32_t));
    uint32_t* p_clr = *vertex_colors;
    for (uint32_t c = 0; c < *nr_of_vertices; ++c)
      *p_clr++ = 0xffffffff;
    }

  p_red = (uint8_t*)(*vertex_colors);
  p_green = p_red + 1;
  p_blue = p_red + 2;
  p_alpha = p_red + 3;

  uint32_t* p_tria_index = NULL;

  long ntriangles = ply_set_read_cb(ply, "face", "vertex_indices", read_face, (void*)(&p_tria_index), 0);
  if (ntriangles == 0)
    ntriangles = ply_set_read_cb(ply, "face", "vertex_index", read_face, (void*)(&p_tria_index), 0);

  *nr_of_triangles = (uint32_t)ntriangles;

  if (ntriangles > 0)
    *triangles = (uint32_t*)trico_malloc(*nr_of_triangles * 3 * sizeof(uint32_t));

  p_tria_index = (uint32_t*)(*triangles);

  float* p_uv = NULL;

  long ntexcoords = ply_set_read_cb(ply, "face", "texcoord", read_texcoord, (void*)(&p_uv), 0);

  if (ntexcoords && ((uint32_t)ntexcoords != *nr_of_triangles))
    {
    if (*nr_of_vertices)
      {
      free(*vertices);
      free(*vertex_normals);
      free(*vertex_colors);
      *vertices = NULL;
      *vertex_normals = NULL;
      *vertex_colors = NULL;
      *nr_of_vertices = 0;
      }
    if (*nr_of_triangles)
      {
      free(*triangles);
      *triangles = NULL;
      *nr_of_triangles = 0;
      }
    ply_close(ply);
    return 0;
    }

  if (ntexcoords > 0)
    *texcoords = (float*)trico_malloc(*nr_of_triangles * 6 * sizeof(float));

  p_uv = (float*)(*texcoords);

  if (!ply_read(ply))
    return 0;

  ply_close(ply);

  return 1;
  }